

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SignedConversionFunction::SignedConversionFunction
          (SignedConversionFunction *this,KnownSystemName knownNameId,bool toSigned)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__SignedConversionFunction_00d7d9b8;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  return;
}

Assistant:

SignedConversionFunction(KnownSystemName knownNameId, bool toSigned) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), toSigned(toSigned) {}